

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3SnippetAdvance(char **ppIter,int *piIter,int iNext)

{
  byte bVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  int iVar4;
  byte *p;
  undefined8 uStack_38;
  
  p = (byte *)*ppIter;
  if (p != (byte *)0x0) {
    iVar4 = *piIter;
    if (iVar4 < iNext) {
      uStack_38 = in_RAX;
      do {
        bVar1 = *p;
        if (bVar1 < 2) {
          iVar4 = -1;
          p = (byte *)0x0;
          break;
        }
        if ((char)bVar1 < '\0') {
          uVar2 = sqlite3Fts3GetVarint32((char *)p,(int *)((long)&uStack_38 + 4));
          uVar3 = (ulong)uVar2;
          uVar2 = uStack_38._4_4_;
        }
        else {
          uVar3 = 1;
          uVar2 = (uint)bVar1;
        }
        p = p + uVar3;
        iVar4 = iVar4 + uVar2 + -2;
      } while (iVar4 < iNext);
    }
    *piIter = iVar4;
    *ppIter = (char *)p;
  }
  return;
}

Assistant:

static void fts3SnippetAdvance(char **ppIter, int *piIter, int iNext){
  char *pIter = *ppIter;
  if( pIter ){
    int iIter = *piIter;

    while( iIter<iNext ){
      if( 0==(*pIter & 0xFE) ){
        iIter = -1;
        pIter = 0;
        break;
      }
      fts3GetDeltaPosition(&pIter, &iIter);
    }

    *piIter = iIter;
    *ppIter = pIter;
  }
}